

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_3_2_core.cpp
# Opt level: O1

bool __thiscall
QOpenGLFunctions_3_2_Core::initializeOpenGLFunctions(QOpenGLFunctions_3_2_Core *this)

{
  QAtomicInt *pQVar1;
  bool bVar2;
  QOpenGLContext *context;
  QOpenGLContext *pQVar3;
  QOpenGLFunctions_1_0_CoreBackend *pQVar4;
  QOpenGLFunctions_1_1_CoreBackend *pQVar5;
  QOpenGLFunctions_1_2_CoreBackend *pQVar6;
  QOpenGLFunctions_1_3_CoreBackend *pQVar7;
  QOpenGLFunctions_1_4_CoreBackend *pQVar8;
  QOpenGLFunctions_1_5_CoreBackend *pQVar9;
  QOpenGLFunctions_2_0_CoreBackend *pQVar10;
  QOpenGLFunctions_2_1_CoreBackend *pQVar11;
  QOpenGLFunctions_3_0_CoreBackend *pQVar12;
  QOpenGLFunctions_3_1_CoreBackend *pQVar13;
  QOpenGLFunctions_3_2_CoreBackend *pQVar14;
  
  bVar2 = QAbstractOpenGLFunctions::isInitialized(&this->super_QAbstractOpenGLFunctions);
  if (bVar2) {
    return true;
  }
  context = (QOpenGLContext *)QOpenGLContext::currentContext();
  pQVar3 = QAbstractOpenGLFunctions::owningContext(&this->super_QAbstractOpenGLFunctions);
  if (pQVar3 == (QOpenGLContext *)0x0) {
LAB_0016eec6:
    pQVar3 = QAbstractOpenGLFunctions::owningContext(&this->super_QAbstractOpenGLFunctions);
    if (pQVar3 != (QOpenGLContext *)0x0) goto LAB_0016efd3;
  }
  else {
    pQVar3 = QAbstractOpenGLFunctions::owningContext(&this->super_QAbstractOpenGLFunctions);
    if (pQVar3 != context) goto LAB_0016eec6;
  }
  bVar2 = isContextCompatible(context);
  if (bVar2) {
    pQVar4 = (QOpenGLFunctions_1_0_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_0_Core);
    this->d_1_0_Core = pQVar4;
    LOCK();
    pQVar1 = &(pQVar4->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar5 = (QOpenGLFunctions_1_1_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_1_Core);
    this->d_1_1_Core = pQVar5;
    LOCK();
    pQVar1 = &(pQVar5->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar6 = (QOpenGLFunctions_1_2_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_2_Core);
    this->d_1_2_Core = pQVar6;
    LOCK();
    pQVar1 = &(pQVar6->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar7 = (QOpenGLFunctions_1_3_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_3_Core);
    this->d_1_3_Core = pQVar7;
    LOCK();
    pQVar1 = &(pQVar7->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar8 = (QOpenGLFunctions_1_4_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_4_Core);
    this->d_1_4_Core = pQVar8;
    LOCK();
    pQVar1 = &(pQVar8->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar9 = (QOpenGLFunctions_1_5_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_5_Core);
    this->d_1_5_Core = pQVar9;
    LOCK();
    pQVar1 = &(pQVar9->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar10 = (QOpenGLFunctions_2_0_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_2_0_Core);
    this->d_2_0_Core = pQVar10;
    LOCK();
    pQVar1 = &(pQVar10->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar11 = (QOpenGLFunctions_2_1_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_2_1_Core);
    this->d_2_1_Core = pQVar11;
    LOCK();
    pQVar1 = &(pQVar11->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar12 = (QOpenGLFunctions_3_0_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_3_0_Core);
    this->d_3_0_Core = pQVar12;
    LOCK();
    pQVar1 = &(pQVar12->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar13 = (QOpenGLFunctions_3_1_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_3_1_Core);
    this->d_3_1_Core = pQVar13;
    LOCK();
    pQVar1 = &(pQVar13->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar14 = (QOpenGLFunctions_3_2_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_3_2_Core);
    this->d_3_2_Core = pQVar14;
    LOCK();
    pQVar1 = &(pQVar14->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    QAbstractOpenGLFunctions::initializeOpenGLFunctions(&this->super_QAbstractOpenGLFunctions);
  }
LAB_0016efd3:
  bVar2 = QAbstractOpenGLFunctions::isInitialized(&this->super_QAbstractOpenGLFunctions);
  return bVar2;
}

Assistant:

bool QOpenGLFunctions_3_2_Core::initializeOpenGLFunctions()
{
    if ( isInitialized() )
        return true;

    QOpenGLContext* context = QOpenGLContext::currentContext();

    // If owned by a context object make sure it is current.
    // Also check that current context is capable of resolving all needed functions
    if (((owningContext() && owningContext() == context) || !owningContext())
        && QOpenGLFunctions_3_2_Core::isContextCompatible(context))
    {
        // Associate with private implementation, creating if necessary
        // Function pointers in the backends are resolved at creation time
        QOpenGLVersionFunctionsBackend* d = nullptr;
        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_0_CoreBackend::versionStatus());
        d_1_0_Core = static_cast<QOpenGLFunctions_1_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_1_CoreBackend::versionStatus());
        d_1_1_Core = static_cast<QOpenGLFunctions_1_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_2_CoreBackend::versionStatus());
        d_1_2_Core = static_cast<QOpenGLFunctions_1_2_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_3_CoreBackend::versionStatus());
        d_1_3_Core = static_cast<QOpenGLFunctions_1_3_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_4_CoreBackend::versionStatus());
        d_1_4_Core = static_cast<QOpenGLFunctions_1_4_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_5_CoreBackend::versionStatus());
        d_1_5_Core = static_cast<QOpenGLFunctions_1_5_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_2_0_CoreBackend::versionStatus());
        d_2_0_Core = static_cast<QOpenGLFunctions_2_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_2_1_CoreBackend::versionStatus());
        d_2_1_Core = static_cast<QOpenGLFunctions_2_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_0_CoreBackend::versionStatus());
        d_3_0_Core = static_cast<QOpenGLFunctions_3_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_1_CoreBackend::versionStatus());
        d_3_1_Core = static_cast<QOpenGLFunctions_3_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_2_CoreBackend::versionStatus());
        d_3_2_Core = static_cast<QOpenGLFunctions_3_2_CoreBackend*>(d);
        d->refs.ref();

        QAbstractOpenGLFunctions::initializeOpenGLFunctions();
    }
    return isInitialized();
}